

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VertexTriangleAdjacency.cpp
# Opt level: O0

void __thiscall
Assimp::VertexTriangleAdjacency::VertexTriangleAdjacency
          (VertexTriangleAdjacency *this,aiFace *pcFaces,uint iNumFaces,uint iNumVertices,
          bool bComputeNumTriangles)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  undefined1 auVar4 [16];
  aiFace *paVar5;
  uint *puVar6;
  ulong uVar7;
  void *pvVar8;
  uint *puVar9;
  uint *ind_1;
  aiFace *paStack_88;
  uint nind_1;
  aiFace *pcFace_2;
  uint *puStack_78;
  uint iLastSum;
  uint *piCur;
  uint *piCurOut;
  uint iSum;
  uint *ind;
  aiFace *paStack_50;
  uint nind;
  aiFace *pcFace_1;
  uint *piEnd;
  uint *pi;
  aiFace *pcFace;
  aiFace *pcFaceEnd;
  uint local_20;
  uint uStack_1c;
  bool bComputeNumTriangles_local;
  uint iNumVertices_local;
  uint iNumFaces_local;
  aiFace *pcFaces_local;
  VertexTriangleAdjacency *this_local;
  
  paVar5 = pcFaces + iNumFaces;
  pi = &pcFaces->mNumIndices;
  local_20 = iNumVertices;
  uStack_1c = iNumFaces;
  _iNumVertices_local = pcFaces;
  pcFaces_local = (aiFace *)this;
  if (iNumVertices == 0) {
    for (; (aiFace *)pi != paVar5; pi = pi + 4) {
      if (pi == (uint *)0x0) {
        __assert_fail("nullptr != pcFace",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/VertexTriangleAdjacency.cpp"
                      ,0x3f,
                      "Assimp::VertexTriangleAdjacency::VertexTriangleAdjacency(aiFace *, unsigned int, unsigned int, bool)"
                     );
      }
      if (*pi != 3) {
        __assert_fail("3 == pcFace->mNumIndices",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/VertexTriangleAdjacency.cpp"
                      ,0x40,
                      "Assimp::VertexTriangleAdjacency::VertexTriangleAdjacency(aiFace *, unsigned int, unsigned int, bool)"
                     );
      }
      puVar6 = std::max<unsigned_int>(&local_20,*(uint **)(pi + 2));
      local_20 = *puVar6;
      puVar6 = std::max<unsigned_int>(&local_20,(uint *)(*(long *)(pi + 2) + 4));
      local_20 = *puVar6;
      puVar6 = std::max<unsigned_int>(&local_20,(uint *)(*(long *)(pi + 2) + 8));
      local_20 = *puVar6;
    }
  }
  this->mNumVertices = local_20 + 1;
  if (bComputeNumTriangles) {
    auVar4 = ZEXT416(local_20 + 1) * ZEXT816(4);
    uVar7 = auVar4._0_8_;
    if (auVar4._8_8_ != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    piEnd = (uint *)operator_new__(uVar7);
    this->mLiveTriangles = piEnd;
    memset(this->mLiveTriangles,0,(ulong)(local_20 + 1) << 2);
    auVar4 = ZEXT416(local_20 + 2) * ZEXT816(4);
    uVar7 = auVar4._0_8_;
    if (auVar4._8_8_ != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    pvVar8 = operator_new__(uVar7);
    this->mOffsetTable = (uint *)((long)pvVar8 + 4);
  }
  else {
    auVar4 = ZEXT416(local_20 + 2) * ZEXT816(4);
    uVar7 = auVar4._0_8_;
    if (auVar4._8_8_ != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    pvVar8 = operator_new__(uVar7);
    piEnd = (uint *)((long)pvVar8 + 4);
    this->mOffsetTable = piEnd;
    memset(this->mOffsetTable,0,(ulong)(local_20 + 1) << 2);
    this->mLiveTriangles = (uint *)0x0;
  }
  piEnd[local_20] = 0;
  for (paStack_50 = _iNumVertices_local; paStack_50 != paVar5; paStack_50 = paStack_50 + 1) {
    uVar1 = paStack_50->mNumIndices;
    puVar6 = paStack_50->mIndices;
    if (uVar1 != 0) {
      piEnd[*puVar6] = piEnd[*puVar6] + 1;
    }
    if (1 < uVar1) {
      piEnd[puVar6[1]] = piEnd[puVar6[1]] + 1;
    }
    if (2 < uVar1) {
      piEnd[puVar6[2]] = piEnd[puVar6[2]] + 1;
    }
  }
  piCurOut._4_4_ = 0;
  piCur = this->mOffsetTable;
  for (puStack_78 = piEnd; puStack_78 != piEnd + local_20 + 1; puStack_78 = puStack_78 + 1) {
    uVar1 = *puStack_78;
    *piCur = piCurOut._4_4_;
    piCur = piCur + 1;
    piCurOut._4_4_ = uVar1 + piCurOut._4_4_;
  }
  puVar6 = this->mOffsetTable;
  uVar7 = SUB168(ZEXT416(piCurOut._4_4_) * ZEXT816(4),0);
  if (SUB168(ZEXT416(piCurOut._4_4_) * ZEXT816(4),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  puVar9 = (uint *)operator_new__(uVar7);
  this->mAdjacencyTable = puVar9;
  piCurOut._4_4_ = 0;
  for (paStack_88 = _iNumVertices_local; paStack_88 != paVar5; paStack_88 = paStack_88 + 1) {
    uVar1 = paStack_88->mNumIndices;
    puVar9 = paStack_88->mIndices;
    if (uVar1 != 0) {
      puVar3 = this->mAdjacencyTable;
      uVar2 = puVar6[*puVar9];
      puVar6[*puVar9] = uVar2 + 1;
      puVar3[uVar2] = piCurOut._4_4_;
    }
    if (1 < uVar1) {
      puVar3 = this->mAdjacencyTable;
      uVar2 = puVar6[puVar9[1]];
      puVar6[puVar9[1]] = uVar2 + 1;
      puVar3[uVar2] = piCurOut._4_4_;
    }
    if (2 < uVar1) {
      puVar3 = this->mAdjacencyTable;
      uVar1 = puVar6[puVar9[2]];
      puVar6[puVar9[2]] = uVar1 + 1;
      puVar3[uVar1] = piCurOut._4_4_;
    }
    piCurOut._4_4_ = piCurOut._4_4_ + 1;
  }
  this->mOffsetTable = this->mOffsetTable + -1;
  *this->mOffsetTable = 0;
  return;
}

Assistant:

VertexTriangleAdjacency::VertexTriangleAdjacency(aiFace *pcFaces,
    unsigned int iNumFaces,
    unsigned int iNumVertices /*= 0*/,
    bool bComputeNumTriangles /*= false*/)
{
    // compute the number of referenced vertices if it wasn't specified by the caller
    const aiFace* const pcFaceEnd = pcFaces + iNumFaces;
    if (0 == iNumVertices)  {
        for (aiFace* pcFace = pcFaces; pcFace != pcFaceEnd; ++pcFace)   {
            ai_assert( nullptr != pcFace );
            ai_assert(3 == pcFace->mNumIndices);
            iNumVertices = std::max(iNumVertices,pcFace->mIndices[0]);
            iNumVertices = std::max(iNumVertices,pcFace->mIndices[1]);
            iNumVertices = std::max(iNumVertices,pcFace->mIndices[2]);
        }
    }

    mNumVertices = iNumVertices + 1;

    unsigned int* pi;

    // allocate storage
    if (bComputeNumTriangles)   {
        pi = mLiveTriangles = new unsigned int[iNumVertices+1];
        ::memset(mLiveTriangles,0,sizeof(unsigned int)*(iNumVertices+1));
        mOffsetTable = new unsigned int[iNumVertices+2]+1;
    } else {
        pi = mOffsetTable = new unsigned int[iNumVertices+2]+1;
        ::memset(mOffsetTable,0,sizeof(unsigned int)*(iNumVertices+1));
        mLiveTriangles = NULL; // important, otherwise the d'tor would crash
    }

    // get a pointer to the end of the buffer
    unsigned int* piEnd = pi+iNumVertices;
    *piEnd++ = 0u;

    // first pass: compute the number of faces referencing each vertex
    for (aiFace* pcFace = pcFaces; pcFace != pcFaceEnd; ++pcFace)
    {
        unsigned nind = pcFace->mNumIndices;
        unsigned * ind = pcFace->mIndices;
        if (nind > 0) pi[ind[0]]++;
        if (nind > 1) pi[ind[1]]++;
        if (nind > 2) pi[ind[2]]++;
    }

    // second pass: compute the final offset table
    unsigned int iSum = 0;
    unsigned int* piCurOut = this->mOffsetTable;
    for (unsigned int* piCur = pi; piCur != piEnd;++piCur,++piCurOut)   {

        unsigned int iLastSum = iSum;
        iSum += *piCur;
        *piCurOut = iLastSum;
    }
    pi = this->mOffsetTable;

    // third pass: compute the final table
    this->mAdjacencyTable = new unsigned int[iSum];
    iSum = 0;
    for (aiFace* pcFace = pcFaces; pcFace != pcFaceEnd; ++pcFace,++iSum)    {
        unsigned nind = pcFace->mNumIndices;
        unsigned * ind = pcFace->mIndices;

        if (nind > 0) mAdjacencyTable[pi[ind[0]]++] = iSum;
        if (nind > 1) mAdjacencyTable[pi[ind[1]]++] = iSum;
        if (nind > 2) mAdjacencyTable[pi[ind[2]]++] = iSum;
    }
    // fourth pass: undo the offset computations made during the third pass
    // We could do this in a separate buffer, but this would be TIMES slower.
    --mOffsetTable;
    *mOffsetTable = 0u;
}